

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O1

bool __thiscall undo::UndoHistory::deleteFirstState(UndoHistory *this)

{
  UndoState *state;
  UndoState *pUVar1;
  UndoState *pUVar2;
  
  state = this->m_first;
  if (this->m_cur == state) {
    return false;
  }
  for (pUVar1 = this->m_last; pUVar1 != (UndoState *)0x0; pUVar1 = pUVar1->m_prev) {
    pUVar2 = state;
    if (pUVar1->m_parent == state) {
      while( true ) {
        if (pUVar2 == pUVar1) {
          while (state != pUVar1) {
            pUVar2 = state->m_next;
            deleteState(this,state);
            state = pUVar2;
          }
          pUVar1->m_prev = (UndoState *)0x0;
          pUVar1->m_parent = (UndoState *)0x0;
          this->m_first = pUVar1;
          return true;
        }
        if (this->m_cur == pUVar2) break;
        pUVar2 = pUVar2->m_next;
      }
      return false;
    }
  }
  if (this->m_last == state) {
    if (state->m_next == (UndoState *)0x0) {
      this->m_first = (UndoState *)0x0;
      this->m_last = (UndoState *)0x0;
      deleteState(this,state);
      return true;
    }
    __assert_fail("m_first->next() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                  0x86,"bool undo::UndoHistory::deleteFirstState()");
  }
  __assert_fail("m_last == m_first",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                0x85,"bool undo::UndoHistory::deleteFirstState()");
}

Assistant:

bool UndoHistory::deleteFirstState()
{
  UNDO_TRACE("UndoHistory::deleteFirstState()\n");

  // We cannot delete the first state if we are in the first state.
  if (m_cur == m_first) {
    UNDO_TRACE(" - Cannot delete first state if it's the current state\n");
    return false;
  }

  UndoState* i = m_last;
  while (i) {
    // If this state depends on the delete one, this "i" is the new
    // m_first undo state.
    if (i->m_parent == m_first) {
      // First we check if the current undo state is one of the states
      // that we're going to delete.
      UndoState* j = m_first;
      while (j != i) {
        // Cannot delete this "j" state because is the current one.
        if (m_cur == j) {
          UNDO_TRACE(" - Cannot delete first state because current state depends on it to go to the last state\n");
          return false;
        }
        j = j->next();
      }

      j = m_first;
      while (j != i) {
        UNDO_TRACE(" - Delete undo state\n");

        UndoState* k = j;
        j = j->next();

        deleteState(k);
      }

      i->m_prev = nullptr;
      i->m_parent = nullptr;
      m_first = i;
      return true;
    }
    i = i->prev();
  }

  UndoState* state = m_first;
  assert(m_last == m_first);
  assert(m_first->next() == nullptr);
  m_first = m_last = nullptr;
  UNDO_TRACE(" - Delete first state only\n");

  deleteState(state);
  return true;
}